

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  EventExpressionSyntax *args_2;
  BinaryEventExpressionSyntax *pBVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  BumpAllocator *in_stack_ffffffffffffffc8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  not_null<slang::syntax::EventExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::EventExpressionSyntax_*> *)0xa50526);
  args_2 = deepClone<slang::syntax::EventExpressionSyntax>
                     ((EventExpressionSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::EventExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::EventExpressionSyntax_*> *)0xa50563);
  deepClone<slang::syntax::EventExpressionSyntax>
            ((EventExpressionSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BinaryEventExpressionSyntax,slang::syntax::EventExpressionSyntax&,slang::parsing::Token,slang::syntax::EventExpressionSyntax&>
                     (this,(EventExpressionSyntax *)TVar2.info,TVar2._0_8_,args_2);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BinaryEventExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BinaryEventExpressionSyntax>(
        *deepClone<EventExpressionSyntax>(*node.left, alloc),
        node.operatorToken.deepClone(alloc),
        *deepClone<EventExpressionSyntax>(*node.right, alloc)
    );
}